

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O0

string * duckdb::PragmaShowTablesExpanded_abi_cxx11_
                   (ClientContext *context,FunctionParameters *parameters)

{
  string *in_RDI;
  
  PragmaShowTablesExpanded_abi_cxx11_();
  return in_RDI;
}

Assistant:

string PragmaShowTablesExpanded(ClientContext &context, const FunctionParameters &parameters) {
	return PragmaShowTablesExpanded();
}